

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUISpriteBank.cpp
# Opt level: O3

void __thiscall irr::gui::CGUISpriteBank::~CGUISpriteBank(CGUISpriteBank *this,void **vtt)

{
  int *piVar1;
  _func_int **pp_Var2;
  IVideoDriver *pIVar3;
  _func_int *p_Var4;
  pointer ppIVar5;
  pointer prVar6;
  
  pp_Var2 = (_func_int **)*vtt;
  (this->super_IGUISpriteBank)._vptr_IGUISpriteBank = pp_Var2;
  *(void **)((long)&(this->super_IGUISpriteBank)._vptr_IGUISpriteBank + (long)pp_Var2[-3]) = vtt[3];
  (*(this->super_IGUISpriteBank)._vptr_IGUISpriteBank[7])();
  pIVar3 = this->Driver;
  if (pIVar3 != (IVideoDriver *)0x0) {
    p_Var4 = pIVar3->_vptr_IVideoDriver[-3];
    piVar1 = (int *)(&pIVar3->field_0x10 + (long)p_Var4);
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (**(code **)(*(long *)((long)&pIVar3->_vptr_IVideoDriver + (long)p_Var4) + 8))();
    }
  }
  ppIVar5 = (this->Textures).m_data.
            super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppIVar5 != (pointer)0x0) {
    operator_delete(ppIVar5,(long)(this->Textures).m_data.
                                  super__Vector_base<irr::video::ITexture_*,_std::allocator<irr::video::ITexture_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppIVar5
                   );
  }
  prVar6 = (this->Rectangles).m_data.
           super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (prVar6 != (pointer)0x0) {
    operator_delete(prVar6,(long)(this->Rectangles).m_data.
                                 super__Vector_base<irr::core::rect<int>,_std::allocator<irr::core::rect<int>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)prVar6);
  }
  ::std::vector<irr::gui::SGUISprite,_std::allocator<irr::gui::SGUISprite>_>::~vector
            ((vector<irr::gui::SGUISprite,_std::allocator<irr::gui::SGUISprite>_> *)
             &(this->super_IGUISpriteBank).field_0x8);
  return;
}

Assistant:

CGUISpriteBank::~CGUISpriteBank()
{
	clear();

	// drop video driver
	if (Driver)
		Driver->drop();
}